

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O1

int main(int argc,PCH *argv)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined8 extraout_RAX;
  long lVar5;
  int extraout_EDX;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  w3Module module;
  undefined1 local_628 [24];
  deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_> dStack_610;
  _Deque_base<w3Label,_std::allocator<w3Label>_> local_5c0;
  w3Module *local_568;
  w3Module local_560;
  
  local_560.name._M_dataplus._M_p = (pointer)&local_560.name.field_2;
  local_560._vptr_w3Module = (_func_int **)&PTR__w3Module_00130940;
  local_560.name._M_string_length = 0;
  local_560.name.field_2._M_local_buf[0] = '\0';
  local_560.mmf.base = (void *)0x0;
  local_560.mmf.size = 0;
  w3Fd::w3Fd(&local_560.mmf.file,-1);
  local_560.base = (uint8_t *)0x0;
  local_560.file_size = 0;
  local_560.end = (uint8_t *)0x0;
  lVar5 = 0;
  do {
    pcVar6 = local_560.sections[0].name.storage.field_2._M_local_buf + lVar5;
    *(undefined4 *)((long)&local_560.sections[0].id + lVar5) = 0;
    *(undefined8 *)((long)&local_560.sections[0].name.data + lVar5) = 0;
    *(undefined8 *)((long)&local_560.sections[0].name.size + lVar5) = 0;
    *(char **)((long)&local_560.sections[0].name.storage._M_dataplus._M_p + lVar5) = pcVar6;
    *(undefined8 *)((long)&local_560.sections[0].name.storage._M_string_length + lVar5) = 0;
    *pcVar6 = '\0';
    *(undefined4 *)((long)&local_560.sections[0].name.builtin + lVar5) = 0;
    (&local_560.sections[0].name.builtinStorage)[lVar5] = false;
    *(undefined8 *)((long)&local_560.sections[0].payload_size + lVar5) = 0;
    *(undefined8 *)((long)&local_560.sections[0].payload + lVar5) = 0;
    lVar5 = lVar5 + 0x50;
  } while (lVar5 != 0x3c0);
  memset(&local_560.function_types,0,0xe1);
  local_560._1276_8_ = 0;
  local_560._1284_8_ = 0;
  local_560._1292_8_ = 0;
  local_560._1300_8_ = 0;
  local_560._1308_8_ = 0;
  local_560._1316_8_ = 0;
  local_560.import_global_count._4_4_ = 0;
  if (argc < 0) {
    main_cold_1();
    local_628._0_8_ = &PTR__w3SourceGen_00130d98;
    std::_Deque_base<w3Label,_std::allocator<w3Label>_>::~_Deque_base(&local_5c0);
    std::deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>::~deque(&dStack_610);
    w3Module::~w3Module(&local_560);
    if (extraout_EDX == 2) {
      main_cold_3();
    }
    else {
      if (extraout_EDX != 1) {
        _Unwind_Resume(extraout_RAX);
      }
      main_cold_2();
    }
  }
  else {
    if ((uint)argc < 2) {
      lVar5 = 1;
      bVar7 = false;
      bVar3 = false;
    }
    else {
      lVar5 = 1;
      bVar2 = 0;
      uVar8 = 1;
      bVar1 = 0;
      bVar7 = false;
      do {
        pcVar6 = argv[uVar8];
        iVar4 = strcmp(pcVar6,"--cgen");
        if (iVar4 == 0) {
          bVar2 = 1;
          if (uVar8 == 1) {
            lVar5 = 2;
          }
          else if (uVar8 == 2) {
            lVar5 = 1;
          }
        }
        iVar4 = strcmp(pcVar6,"--rust-gen");
        if (iVar4 == 0) {
          bVar1 = 1;
LAB_0011db02:
          if (uVar8 == 1) {
            lVar5 = 2;
          }
          else if (uVar8 == 2) {
            lVar5 = 1;
          }
        }
        else {
          iVar4 = strcmp(pcVar6,"--run-all-exports");
          if (iVar4 == 0) {
            bVar7 = true;
            goto LAB_0011db02;
          }
        }
        uVar8 = uVar8 + 1;
      } while ((uint)argc != uVar8);
      bVar3 = (bool)(bVar2 | bVar1);
    }
    w3Module::read_module(&local_560,argv[lVar5]);
    if ((bVar7) &&
       ((long)local_560.exports.super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_560.exports.super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl.
              super__Vector_impl_data._M_start != 0)) {
      lVar9 = ((long)local_560.exports.super__Vector_base<w3Export,_std::allocator<w3Export>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_560.exports.super__Vector_base<w3Export,_std::allocator<w3Export>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
      lVar9 = lVar9 + (ulong)(lVar9 == 0);
      lVar5 = 0;
      do {
        if (*(int *)((long)&(local_560.exports.
                             super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl.
                             super__Vector_impl_data._M_start)->tag + lVar5) == 0) {
          local_628._16_8_ = (pointer)0x0;
          dStack_610.super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          dStack_610.super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>._M_impl.
          super__Deque_impl_data._M_map_size = 0;
          local_628._8_8_ = (w3DecodedInstruction *)0x0;
          local_628._0_8_ = &PTR__w3Interp_00130c20;
          dStack_610.super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
          dStack_610.super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          dStack_610.super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          dStack_610.super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_node = (_Map_pointer)(local_628 + 0x10);
          w3Interp::interp((w3Interp *)local_628,&local_560,
                           (w3Export *)
                           ((long)&((local_560.exports.
                                     super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl
                                     .super__Vector_impl_data._M_start)->name).data + lVar5));
          if ((pointer)local_628._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_628._16_8_,
                            dStack_610.
                            super__Deque_base<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>.
                            _M_impl.super__Deque_impl_data._M_map_size - local_628._16_8_);
          }
        }
        lVar5 = lVar5 + 0x48;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (bVar3) {
      w3SourceGen::w3SourceGen((w3SourceGen *)local_628);
      local_628._0_8_ = &PTR__w3SourceGen_00130d40;
      local_568 = (w3Module *)0x0;
      WasmCGen::interp((WasmCGen *)local_628,&local_560,(w3Export *)0x0);
      local_628._0_8_ = &PTR__w3SourceGen_00130d98;
      std::_Deque_base<w3Label,_std::allocator<w3Label>_>::~_Deque_base(&local_5c0);
      std::deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>::~deque(&dStack_610);
    }
    w3Module::~w3Module(&local_560);
  }
  return 0;
}

Assistant:

int
main (int argc, PCH* argv)
{
    if (IsDebuggerPresent ()) DebugBreak ();
#if 0 // test code TODO move it elsewhere? Or under a switch.
    printf ("3 %s\n", InstructionName (1));
    printf ("4 %s\n", InstructionName (0x44));
    char buf [99] = { 0 };
    uint32_t len;
#define Xd(x) printf ("%s %I64d\n", #x, x);
#define Xx(x) printf ("%s %I64x\n", #x, x);
#define Xs(x) len = x; buf [len] = 0; printf ("%s %s\n", #x, buf);
    Xd (UIntGetPrecision (0));
    Xd (UIntGetPrecision (1));
    Xd (UIntGetPrecision (0x2));
    Xd (UIntGetPrecision (0x2));
    Xd (UIntGetPrecision (0x7));
    Xd (UIntGetPrecision (0x8));
    Xd (IntGetPrecision (0));
    Xd (IntGetPrecision (1));
    Xd (IntGetPrecision (0x2));
    Xd (IntGetPrecision (0x2));
    Xd (IntGetPrecision (0x7));
    Xd (IntGetPrecision (0x8));
    Xd (IntGetPrecision (0));
    Xd (IntGetPrecision (-1));
    Xd (IntGetPrecision (-0x2));
    Xd (IntGetPrecision (-0x2));
    Xd (IntGetPrecision (-0x7));
    Xd (IntGetPrecision (-0x8));
    Xd (IntToDec_GetLength (0))
    Xd (IntToDec_GetLength (1))
    Xd (IntToDec_GetLength (2))
    Xd (IntToDec_GetLength (300))
    Xd (IntToDec_GetLength (-1))
    Xx (SignExtend (0xf, 0));
    Xx (SignExtend (0xf, 1));
    Xx (SignExtend (0xf, 2));
    Xx (SignExtend (0xf, 3));
    Xx (SignExtend (0xf, 4));
    Xx (SignExtend (0xf, 5));
    Xd (IntToHex_GetLength (0xffffffffa65304e4));
    Xd (IntToHex_GetLength (0xfffffffa65304e4));
    Xd (IntToHex_GetLength (-1));
    Xd (IntToHex_GetLength (-1ui64>>4));
    Xd (IntToHex_GetLength (0xf));
    Xd (IntToHex_GetLength (32767));
    Xd (IntToHex_GetLength (-32767));
    Xs (IntToHex (32767, buf));
    Xs (IntToHex (-32767, buf));
    Xs (IntToHex8 (0x123, buf));
    Xs (IntToHex8 (0xffffffffa65304e4, buf));
    Xs (IntToHex8 (-1, buf));
    Xs (IntToHex (0x1, buf));
    Xs (IntToHex (0x12, buf));
    Xs (IntToHex (0x123, buf));
    Xs (IntToHex (0x12345678, buf));
    Xs (IntToHex (-1, buf));
    Xd (IntToHex_GetLength (0x1));
    Xd (IntToHex_GetLength (0x12));
    Xd (IntToHex_GetLength (0x12345678));
    Xd (IntToHex_GetLength (0x01234567));
    Xd (IntToHex_GetLength (-1));
    Xd (IntToHex_GetLength (~0u >> 1));
    Xd (IntToHex_GetLength (~0u >> 2));
    Xd (IntToHex_GetLength (~0u >> 4));
    exit (0);
#endif
#if 1
    try
#endif
    {
        // FIXME command line parsing
        // FIXME verbosity
        w3Module module;

        // Support --run-all-exports for wabt test suite.

        size_t file = 1;
        size_t i = 0;
        bool run_all_exports = 0;
        bool rust_gen = 0;
        bool cgen = 0;

        Assert(argc >= 0);
        for (i = 1 ; i < (uint32_t)argc; ++i)
        {
            if (strcmp (argv [i], "--cgen") == 0)
            {
                cgen = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
            if (strcmp (argv [i], "--rust-gen") == 0)
            {
                rust_gen = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
            else if (strcmp (argv [i], "--run-all-exports") == 0)
            {
                run_all_exports = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
        }

        module.read_module (argv [file]);

        if (run_all_exports)
        {
            const size_t j = module.exports.size ();
            for (i = 0; i < j; ++i)
            {
                w3Export* const xport = &module.exports [i];
                if (xport->tag != w3ExportTag_Function)
                    continue;
                w3Interp().interp (&module, xport);
            }
        }

        if (cgen || rust_gen)
        {
            WasmCGen().interp (&module);
        }
    }
#if 1
    catch (int er)
    {
        fprintf (stderr, "error 0x%08X\n", er);
    }
    catch (const std::string& er)
    {
        fprintf (stderr, "%s", er.c_str ());
    }
#endif
    return 0;
}